

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

matches * catmatches(matches *a,matches *b)

{
  int iVar1;
  match *pmVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (0 < b->mnum) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      iVar1 = a->mmax;
      if (iVar1 <= a->mnum) {
        iVar3 = iVar1 * 2;
        if (iVar1 == 0) {
          iVar3 = 0x10;
        }
        a->mmax = iVar3;
        pmVar2 = (match *)realloc(a->m,(long)iVar3 * 0xb8);
        a->m = pmVar2;
      }
      iVar1 = a->mnum;
      a->mnum = iVar1 + 1;
      memcpy(a->m + iVar1,(void *)((long)b->m->a + lVar5 + -8),0xb8);
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0xb8;
    } while (lVar4 < b->mnum);
  }
  free(b->m);
  free(b);
  return a;
}

Assistant:

struct matches *catmatches(struct matches *a, struct matches *b) {
	int i;
	for (i = 0; i < b->mnum; i++)
		ADDARRAY(a->m, b->m[i]);
	free(b->m);
	free(b);
	return a;
}